

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

string * __thiscall
fasttext::Args::metricToString_abi_cxx11_(string *__return_storage_ptr__,Args *this,metric_name mn)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (mn == labelf1score) {
    pcVar2 = "labelf1score";
    paVar1 = &local_a;
  }
  else if (mn == f1score) {
    pcVar2 = "f1score";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "Unknown metric name!";
    paVar1 = &local_b;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Args::metricToString(metric_name mn) const {
  switch (mn) {
    case metric_name::f1score:
      return "f1score";
    case metric_name::labelf1score:
      return "labelf1score";
  }
  return "Unknown metric name!"; // should never happen
}